

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O0

QAccessibleInterface * __thiscall
QAccessibleAbstractScrollArea::childAt(QAccessibleAbstractScrollArea *this,int x,int y)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  const_reference ppQVar4;
  QPoint *in_RDI;
  long in_FS_OFFSET;
  int i;
  QRect rect;
  QPoint wpos;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  QPoint *in_stack_ffffffffffffff60;
  QWidget *pos;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff80;
  int iVar5;
  int iVar6;
  undefined8 local_68;
  QAccessibleAbstractScrollArea *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  abstractScrollArea((QAccessibleAbstractScrollArea *)0x7d5c58);
  bVar2 = QWidget::isVisible((QWidget *)0x7d5c60);
  if (bVar2) {
    iVar5 = 0;
    while( true ) {
      iVar6 = iVar5;
      iVar3 = (**(code **)((long)*in_RDI + 0x50))();
      if (iVar3 <= iVar5) break;
      accessibleChildren(in_stack_ffffffffffffffa8);
      ppQVar4 = QList<QWidget_*>::at
                          ((QList<QWidget_*> *)in_stack_ffffffffffffff60,
                           CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      pos = *ppQVar4;
      QPoint::QPoint(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
      QWidget::mapToGlobal((QWidget *)CONCAT44(iVar5,in_stack_ffffffffffffff70),(QPoint *)pos);
      QList<QWidget_*>::~QList((QList<QWidget_*> *)0x7d5d08);
      accessibleChildren(in_stack_ffffffffffffffa8);
      QList<QWidget_*>::at
                ((QList<QWidget_*> *)in_stack_ffffffffffffff60,
                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      QWidget::size((QWidget *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      QRect::QRect((QRect *)CONCAT44(iVar6,in_stack_ffffffffffffff80),in_RDI,
                   (QSize *)CONCAT44(iVar5,in_stack_ffffffffffffff70));
      QList<QWidget_*>::~QList((QList<QWidget_*> *)0x7d5d6c);
      bVar2 = QRect::contains((QRect *)CONCAT44(iVar5,in_stack_ffffffffffffff70),
                              (int)((ulong)pos >> 0x20),(int)pos);
      if (bVar2) {
        local_68 = (QAccessibleInterface *)(**(code **)((long)*in_RDI + 0x48))(in_RDI,iVar6);
        goto LAB_007d5db5;
      }
      iVar5 = iVar6 + 1;
    }
    local_68 = (QAccessibleInterface *)0x0;
  }
  else {
    local_68 = (QAccessibleInterface *)0x0;
  }
LAB_007d5db5:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_68;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleAbstractScrollArea::childAt(int x, int y) const
{
    if (!abstractScrollArea()->isVisible())
        return nullptr;

    for (int i = 0; i < childCount(); ++i) {
        QPoint wpos = accessibleChildren().at(i)->mapToGlobal(QPoint(0, 0));
        QRect rect = QRect(wpos, accessibleChildren().at(i)->size());
        if (rect.contains(x, y))
            return child(i);
    }
    return nullptr;
}